

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParseTools.cpp
# Opt level: O0

bool Rml::XMLParseTools::ReadAttribute(char **string,String *name,String *value)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool local_34;
  bool local_33;
  bool quoted;
  char *pcStack_30;
  bool found_whitespace;
  char *ptr;
  String *value_local;
  String *name_local;
  char **string_local;
  
  pcStack_30 = *string;
  ::std::__cxx11::string::operator=((string *)name,"");
  ::std::__cxx11::string::operator=((string *)value,"");
  while (bVar1 = StringUtilities::IsWhitespace(*pcStack_30), bVar1) {
    pcStack_30 = pcStack_30 + 1;
  }
  bVar1 = false;
  while( true ) {
    local_33 = false;
    if ((*pcStack_30 != '=') && (local_33 = false, *pcStack_30 != '>')) {
      local_34 = true;
      if (bVar1) {
        local_34 = StringUtilities::IsWhitespace(*pcStack_30);
      }
      local_33 = local_34;
    }
    if (local_33 == false) break;
    bVar3 = StringUtilities::IsWhitespace(*pcStack_30);
    if (bVar3) {
      bVar1 = true;
    }
    else {
      ::std::__cxx11::string::operator+=((string *)name,*pcStack_30);
    }
    pcStack_30 = pcStack_30 + 1;
  }
  if (*pcStack_30 == '>') {
    return false;
  }
  if (*pcStack_30 == '=') {
    bVar1 = false;
    while( true ) {
      bVar2 = StringUtilities::IsWhitespace(*pcStack_30);
      bVar3 = true;
      if (((!bVar2) && (bVar3 = true, *pcStack_30 != '\'')) && (bVar3 = true, *pcStack_30 != '\"'))
      {
        bVar3 = *pcStack_30 == '=';
      }
      if (!bVar3) break;
      if ((*pcStack_30 == '\'') || (*pcStack_30 == '\"')) {
        bVar1 = true;
      }
      pcStack_30 = pcStack_30 + 1;
    }
    if (*pcStack_30 == '>') {
      return false;
    }
    while( true ) {
      bVar3 = false;
      if (((*pcStack_30 != '\'') && (bVar3 = false, *pcStack_30 != '\"')) &&
         ((bVar3 = false, *pcStack_30 != '>' && (bVar3 = true, *pcStack_30 == ' ')))) {
        bVar3 = bVar1;
      }
      if (!bVar3) break;
      ::std::__cxx11::string::operator+=((string *)value,*pcStack_30);
      pcStack_30 = pcStack_30 + 1;
    }
    if (*pcStack_30 == '>') {
      return false;
    }
    if (bVar1) {
      pcStack_30 = pcStack_30 + 1;
    }
  }
  else {
    pcStack_30 = pcStack_30 + -1;
  }
  *string = pcStack_30;
  return true;
}

Assistant:

bool XMLParseTools::ReadAttribute(const char*& string, String& name, String& value)
{
	const char* ptr = string;

	name = "";
	value = "";

	// Skip whitespace
	while (StringUtilities::IsWhitespace(*ptr))
		ptr++;

	// Look for the end of the attribute name
	bool found_whitespace = false;
	while (*ptr != '=' && *ptr != '>' && (!found_whitespace || StringUtilities::IsWhitespace(*ptr)))
	{
		if (StringUtilities::IsWhitespace(*ptr))
			found_whitespace = true;
		else
			name += *ptr;
		ptr++;
	}
	if (*ptr == '>')
		return false;

	// If we stopped on an equals, parse the value
	if (*ptr == '=')
	{
		// Skip over white space, ='s and quotes
		bool quoted = false;
		while (StringUtilities::IsWhitespace(*ptr) || *ptr == '\'' || *ptr == '"' || *ptr == '=')
		{
			if (*ptr == '\'' || *ptr == '"')
				quoted = true;
			ptr++;
		}
		if (*ptr == '>')
			return false;

		// Store the value
		while (*ptr != '\'' && *ptr != '"' && *ptr != '>' && (*ptr != ' ' || quoted))
		{
			value += *ptr++;
		}
		if (*ptr == '>')
			return false;

		// Advance passed the quote
		if (quoted)
			ptr++;
	}
	else
	{
		ptr--;
	}

	// Update the string pointer
	string = ptr;

	return true;
}